

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O0

VectorXd RadarCartesianToPolar(VectorXd *x_state)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  DenseIndex extraout_RDX;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RSI;
  double dVar2;
  VectorXd VVar3;
  double local_80;
  double local_78 [3];
  double local_60;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  undefined1 local_35;
  float local_34;
  float local_30;
  float rho_dot;
  float phi;
  float rho;
  float vy;
  float vx;
  float py;
  float px;
  VectorXd *x_state_local;
  VectorXd *z_pred;
  
  _py = in_RSI;
  x_state_local = x_state;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](in_RSI,0);
  vx = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](_py,1);
  vy = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](_py,2);
  rho = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](_py,3);
  phi = (float)*pdVar1;
  dVar2 = std::sqrt((double)(ulong)(uint)(vx * vx + vy * vy));
  rho_dot = SUB84(dVar2,0);
  dVar2 = std::atan2((double)(ulong)(uint)vy,(double)(ulong)(uint)vx);
  local_30 = SUB84(dVar2,0);
  if (rho_dot < 1e-06) {
    rho_dot = 1e-06;
  }
  local_34 = (vx * rho + vy * phi) / rho_dot;
  local_35 = 0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(x_state,3);
  local_60 = (double)rho_dot;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x_state,&local_60);
  local_78[0] = (double)local_30;
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                   (&local_58,local_78);
  local_80 = (double)local_34;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this,&local_80);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_58);
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)x_state;
  return (VectorXd)VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd RadarCartesianToPolar(const VectorXd &x_state){
  /*
   * convert measurements from cartesian coordinates (x, y, vx, vy) to
   * polar (rho, phi, rho_dot) coordinates
  */
  float px, py, vx, vy;
  px = x_state[0];
  py = x_state[1];
  vx = x_state[2];
  vy = x_state[3];

  float rho, phi, rho_dot;
  rho = sqrt(px*px + py*py);
  phi = atan2(py, px);  // returns values between -pi and pi

  // if rho is very small, set it to 0.0001 to avoid division by 0 in computing rho_dot
  if(rho < 0.000001)
    rho = 0.000001;

  rho_dot = (px * vx + py * vy) / rho;

  VectorXd z_pred = VectorXd(3);
  z_pred << rho, phi, rho_dot;

  return z_pred;

}